

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkOptionsExpression
          (cmGeneratorExpressionDAGChecker *this)

{
  long *plVar1;
  size_type sVar2;
  cmGeneratorExpressionDAGChecker *pcVar3;
  bool bVar4;
  
  do {
    pcVar3 = this;
    this = pcVar3->Parent;
  } while (pcVar3->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  plVar1 = (long *)(pcVar3->Property)._M_dataplus._M_p;
  sVar2 = (pcVar3->Property)._M_string_length;
  if (sVar2 == 0xb) {
    bVar4 = *(long *)((long)plVar1 + 3) == 0x455059545f52454b && *plVar1 == 0x545f52454b4e494c;
  }
  else {
    if (sVar2 != 0xc) {
      return false;
    }
    bVar4 = (int)plVar1[1] == 0x534e4f49 && *plVar1 == 0x54504f5f4b4e494c;
  }
  return bVar4;
}

Assistant:

cmGeneratorExpressionDAGChecker const* cmGeneratorExpressionDAGChecker::Top()
  const
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }
  return top;
}